

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
StringInstance::op_pushBack
          (string *__return_storage_ptr__,StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *str;
  bool bVar1;
  undefined8 *puVar2;
  char *pcVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  str = (arguments->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)str == 0x20) {
    bVar1 = Grammar::is_character_value(str);
    if (bVar1) {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct((ulong)local_40,'\x01');
      std::__cxx11::string::_M_append((char *)&this->_value,(ulong)local_40[0]);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0]);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
      return __return_storage_ptr__;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "RuntimeError: invalid argument.";
  }
  else {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "RuntimeError: wrong number of arguments.";
  }
  *puVar2 = pcVar3;
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_pushBack(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (!Grammar::is_character_value(arguments[0]))
        throw EXC_INVALID_ARGUMENT;
    _value += std::string(1, arguments[0][1]);
    return "null";
}